

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O2

int xmlBufAdd(xmlBufPtr buf,xmlChar *str,size_t len)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  size_t sVar5;
  
  iVar1 = -1;
  if ((buf != (xmlBufPtr)0x0) && ((buf->flags & 7) == 0)) {
    if (len != 0) {
      if (str == (xmlChar *)0x0) {
        return -1;
      }
      uVar2 = (ulong)buf->compat_size;
      uVar4 = buf->size;
      if (buf->size != uVar2 && uVar2 < 0x7fffffff) {
        buf->size = uVar2;
        uVar4 = uVar2;
      }
      uVar3 = (ulong)buf->compat_use;
      uVar2 = buf->use;
      if (buf->use != uVar3 && uVar3 < 0x7fffffff) {
        buf->use = uVar3;
        uVar2 = uVar3;
      }
      if (uVar4 - uVar2 < len) {
        iVar1 = xmlBufGrowInternal(buf,len);
        if (iVar1 < 0) {
          return -1;
        }
        uVar2 = buf->use;
      }
      memmove(buf->content + uVar2,str,len);
      sVar5 = len + buf->use;
      buf->use = sVar5;
      buf->content[sVar5] = '\0';
      uVar4 = buf->size;
      if (0x7ffffffe < uVar4) {
        uVar4 = 0x7fffffff;
      }
      buf->compat_size = (uint)uVar4;
      uVar4 = 0x7fffffff;
      if (buf->use < 0x7fffffff) {
        uVar4 = buf->use;
      }
      buf->compat_use = (uint)uVar4;
    }
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
xmlBufAdd(xmlBufPtr buf, const xmlChar *str, size_t len) {
    if ((buf == NULL) || (BUF_ERROR(buf)) || (BUF_STATIC(buf)))
        return(-1);
    if (len == 0)
        return(0);
    if (str == NULL)
	return(-1);
    CHECK_COMPAT(buf)

    if (len > buf->size - buf->use) {
        if (xmlBufGrowInternal(buf, len) < 0)
            return(-1);
    }

    memmove(&buf->content[buf->use], str, len);
    buf->use += len;
    buf->content[buf->use] = 0;

    UPDATE_COMPAT(buf)
    return(0);
}